

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O0

bool __thiscall ON_BoundingBox::Transform(ON_BoundingBox *this,ON_Xform *xform)

{
  bool local_31;
  undefined1 local_30 [7];
  bool rc;
  ON_3dPointArray corners;
  ON_Xform *xform_local;
  ON_BoundingBox *this_local;
  
  corners.super_ON_SimpleArray<ON_3dPoint>._16_8_ = xform;
  ON_3dPointArray::ON_3dPointArray((ON_3dPointArray *)local_30);
  local_31 = GetCorners(this,(ON_3dPointArray *)local_30);
  if ((local_31) &&
     (local_31 = ON_3dPointArray::Transform
                           ((ON_3dPointArray *)local_30,
                            (ON_Xform *)corners.super_ON_SimpleArray<ON_3dPoint>._16_8_), local_31))
  {
    local_31 = Set(this,(ON_SimpleArray<ON_3dPoint> *)local_30,0);
  }
  ON_3dPointArray::~ON_3dPointArray((ON_3dPointArray *)local_30);
  return local_31;
}

Assistant:

bool ON_BoundingBox::Transform( const ON_Xform& xform )
{
  ON_3dPointArray corners;
  bool rc =  GetCorners( corners );
  if (rc) {
    rc = corners.Transform(xform);
    if (rc)
      rc = Set(corners);
  }
  return rc;
}